

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O2

int __thiscall BitStreamReader::showBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  undefined8 *puVar5;
  int iVar6;
  byte bVar7;
  
  if ((num < 0x20) && (num <= (this->super_BitStream).m_totalBits)) {
    uVar4 = this->m_curVal;
    uVar1 = this->m_bitLeft;
    cVar3 = (char)uVar1;
    cVar2 = (char)num;
    if (uVar1 < num) {
      iVar6 = (uVar4 & BitStream::m_masks[uVar1]) << (cVar2 - cVar3 & 0x1fU);
      uVar4 = getCurVal(this,(this->super_BitStream).m_buffer + 1);
      bVar7 = (cVar3 - cVar2) + 0x20;
    }
    else {
      bVar7 = cVar3 - cVar2;
      iVar6 = 0;
    }
    return (uVar4 >> (bVar7 & 0x1f)) + iVar6 & BitStream::m_masks[num];
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = &PTR__exception_00249978;
  __cxa_throw(puVar5,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

[[nodiscard]] int showBits(const unsigned num) const
    {
        if (num > INT_BIT - 1 || m_totalBits < num)
            THROW_BITSTREAM_ERR;
        unsigned prevVal = 0;
        unsigned bitLeft = m_bitLeft;
        unsigned curVal = m_curVal;
        if (num <= bitLeft)
            bitLeft -= num;
        else
        {
            prevVal = (curVal & m_masks[bitLeft]) << (num - bitLeft);
            curVal = getCurVal(m_buffer + 1);
            bitLeft += INT_BIT - num;
        }
        return static_cast<int>(prevVal + (curVal >> bitLeft) & m_masks[num]);
    }